

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O1

mz_bool tdefl_output_buffer_putter(void *pBuf,int len,void *pUser)

{
  void *pvVar1;
  ulong __size;
  ulong uVar2;
  
  uVar2 = *pUser + (long)len;
  __size = *(ulong *)((long)pUser + 8);
  if (__size < uVar2) {
    if (*(int *)((long)pUser + 0x18) == 0) {
      return 0;
    }
    do {
      __size = __size * 2;
      if (__size < 0x81) {
        __size = 0x80;
      }
    } while (__size < uVar2);
    pvVar1 = realloc(*(void **)((long)pUser + 0x10),__size);
    if (pvVar1 == (void *)0x0) {
      return 0;
    }
    *(void **)((long)pUser + 0x10) = pvVar1;
    *(ulong *)((long)pUser + 8) = __size;
  }
  memcpy((void *)(*(long *)((long)pUser + 0x10) + *pUser),pBuf,(long)len);
  *(ulong *)pUser = uVar2;
  return 1;
}

Assistant:

static mz_bool tdefl_output_buffer_putter(const void *pBuf, int len, void *pUser)
{
    tdefl_output_buffer *p = (tdefl_output_buffer *)pUser;
    size_t new_size = p->m_size + len;
    if (new_size > p->m_capacity)
    {
        size_t new_capacity = p->m_capacity;
        mz_uint8 *pNew_buf;
        if (!p->m_expandable)
            return MZ_FALSE;
        do
        {
            new_capacity = MZ_MAX(128U, new_capacity << 1U);
        } while (new_size > new_capacity);
        pNew_buf = (mz_uint8 *)MZ_REALLOC(p->m_pBuf, new_capacity);
        if (!pNew_buf)
            return MZ_FALSE;
        p->m_pBuf = pNew_buf;
        p->m_capacity = new_capacity;
    }
    memcpy((mz_uint8 *)p->m_pBuf + p->m_size, pBuf, len);
    p->m_size = new_size;
    return MZ_TRUE;
}